

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_section.hpp
# Opt level: O0

void __thiscall
ELFIO::section_impl<ELFIO::Elf64_Shdr>::save
          (section_impl<ELFIO::Elf64_Shdr> *this,ostream *stream,streampos header_offset,
          streampos data_offset)

{
  streampos data_offset_00;
  streampos header_offset_00;
  bool bVar1;
  uint uVar2;
  int iVar3;
  Elf64_Off EVar4;
  uint64_t uVar5;
  undefined4 extraout_var;
  ostream *stream_local;
  section_impl<ELFIO::Elf64_Shdr> *this_local;
  streampos data_offset_local;
  streampos header_offset_local;
  
  data_offset_local._M_off = (streamoff)data_offset._M_state;
  this_local = (section_impl<ELFIO::Elf64_Shdr> *)data_offset._M_off;
  data_offset_local._M_state = (__mbstate_t)header_offset._M_off;
  uVar2 = (*(this->super_section)._vptr_section[2])();
  if ((uVar2 & 0xffff) != 0) {
    EVar4 = std::fpos::operator_cast_to_long((fpos *)&this_local);
    (this->header).sh_offset = EVar4;
    uVar5 = endianness_convertor::operator()(this->convertor,(this->header).sh_offset);
    (this->header).sh_offset = uVar5;
  }
  header_offset_00._M_state = header_offset._M_state;
  header_offset_00._M_off._0_4_ = data_offset_local._M_state.__count;
  header_offset_00._M_off._4_4_ = data_offset_local._M_state.__value;
  save_header(this,stream,header_offset_00);
  iVar3 = (*(this->super_section)._vptr_section[5])();
  if ((((iVar3 != 8) && (iVar3 = (*(this->super_section)._vptr_section[5])(), iVar3 != 0)) &&
      (iVar3 = (*(this->super_section)._vptr_section[0x13])(), CONCAT44(extraout_var,iVar3) != 0))
     && (bVar1 = std::operator!=(&this->data,(nullptr_t)0x0), bVar1)) {
    data_offset_00._M_state.__count = (undefined4)data_offset_local._M_off;
    data_offset_00._M_state.__value =
         (anon_union_4_2_91654ee9_for___value)data_offset_local._M_off._4_4_;
    data_offset_00._M_off = (streamoff)this_local;
    save_data(this,stream,data_offset_00);
  }
  return;
}

Assistant:

void save( std::ostream&  stream,
               std::streampos header_offset,
               std::streampos data_offset ) override
    {
        if ( 0 != get_index() ) {
            header.sh_offset = decltype( header.sh_offset )( data_offset );
            header.sh_offset = ( *convertor )( header.sh_offset );
        }

        save_header( stream, header_offset );
        if ( get_type() != SHT_NOBITS && get_type() != SHT_NULL &&
             get_size() != 0 && data != nullptr ) {
            save_data( stream, data_offset );
        }
    }